

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode readwrite_data(Curl_easy *data,connectdata *conn,SingleRequest *k,int *didwhat,_Bool *done,
                       _Bool *comeback)

{
  int iVar1;
  int *piVar2;
  connectdata *pcVar3;
  CURLcode CVar4;
  CHUNKcode code;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  curltime cVar8;
  bool local_d1;
  size_t headlen_1;
  size_t headlen;
  CURLcode local_b8;
  CHUNKcode res;
  CURLcode extra;
  _Bool stop_reading;
  int local_a8;
  undefined4 uStack_a4;
  time_t local_a0;
  int local_98;
  size_t local_90;
  curl_off_t totalleft;
  _Bool is_http3;
  size_t sStack_80;
  _Bool is_http2;
  size_t bytestoread;
  size_t buffersize;
  char *pcStack_68;
  _Bool is_empty_data;
  char *buf;
  int maxloops;
  _Bool readmore;
  size_t excess;
  ssize_t nread;
  _Bool *p_Stack_40;
  CURLcode result;
  _Bool *comeback_local;
  _Bool *done_local;
  int *didwhat_local;
  SingleRequest *k_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  nread._4_4_ = CURLE_OK;
  _maxloops = (char *)0x0;
  buf._7_1_ = 0;
  buf._0_4_ = 100;
  pcStack_68 = (data->state).buffer;
  *done = false;
  *comeback = false;
  p_Stack_40 = comeback;
  comeback_local = done;
  done_local = (_Bool *)didwhat;
  didwhat_local = (int *)k;
  k_local = (SingleRequest *)conn;
  conn_local = (connectdata *)data;
  while( true ) {
    buffersize._7_1_ = 0;
    bytestoread = (size_t)*(uint *)&conn_local[1].http_proxy.field_0x2c;
    local_d1 = false;
    if ((*(uint *)(k_local[4].writebytecount + 0x84) & 3) != 0) {
      local_d1 = *(char *)((long)&k_local[6].start.tv_sec + 7) == '\x14';
    }
    totalleft._7_1_ = local_d1;
    totalleft._6_1_ = 0;
    sStack_80 = bytestoread;
    if ((((local_d1 == false) && (*(long *)didwhat_local != -1)) &&
        ((*(ushort *)((long)didwhat_local + 0xd9) & 1) == 0)) &&
       (local_90 = *(long *)didwhat_local - *(long *)(didwhat_local + 4),
       (long)local_90 < (long)bytestoread)) {
      sStack_80 = local_90;
    }
    if (sStack_80 == 0) {
      excess = 0;
    }
    else {
      nread._4_4_ = Curl_read((Curl_easy *)conn_local,(curl_socket_t)k_local[4].start.tv_sec,
                              pcStack_68,sStack_80,(ssize_t *)&excess);
      if (nread._4_4_ == CURLE_AGAIN) goto LAB_00130484;
      if (nread._4_4_ != CURLE_OK) {
        return nread._4_4_;
      }
    }
    if (*(long *)(didwhat_local + 4) == 0) {
      cVar8 = Curl_pgrsTime((Curl_easy *)conn_local,TIMER_STARTTRANSFER);
      piVar2 = didwhat_local;
      local_a0 = cVar8.tv_sec;
      local_98 = cVar8.tv_usec;
      if (didwhat_local[0x22] != 0) {
        cVar8 = Curl_now();
        _extra = cVar8.tv_sec;
        local_a8 = cVar8.tv_usec;
        *(time_t *)(piVar2 + 0x1e) = _extra;
        *(ulong *)(piVar2 + 0x20) = CONCAT44(uStack_a4,local_a8);
      }
    }
    *(uint *)done_local = *(uint *)done_local | 1;
    buffersize._7_1_ = false;
    if (excess == 0) {
      buffersize._7_1_ = *(long *)(didwhat_local + 0x28) == 0;
    }
    if (((long)excess < 1) && (!(bool)buffersize._7_1_)) {
      didwhat_local[0x1d] = didwhat_local[0x1d] & 0xfffffffe;
      goto LAB_00130484;
    }
    pcStack_68[excess] = '\0';
    *(char **)(didwhat_local + 0x18) = pcStack_68;
    if (*(long *)(k_local[4].writebytecount + 0x68) != 0) {
      CVar4 = (**(code **)(k_local[4].writebytecount + 0x68))
                        (conn_local,k_local,&excess,(long)&buf + 7);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      nread._4_4_ = CURLE_OK;
      if ((buf._7_1_ & 1) != 0) {
        nread._4_4_ = CURLE_OK;
        goto LAB_00130484;
      }
    }
    if ((*(ushort *)((long)didwhat_local + 0xd9) & 1) != 0) {
      res._3_1_ = CHUNKE_OK >> 0x18;
      nread._4_4_ = Curl_http_readwrite_headers
                              ((Curl_easy *)conn_local,(connectdata *)k_local,(ssize_t *)&excess,
                               (_Bool *)((long)&res + 3));
      if (nread._4_4_ != CURLE_OK) {
        return nread._4_4_;
      }
      if (((*(long *)(k_local[4].writebytecount + 0x68) != 0) && (*(long *)(didwhat_local + 2) < 1))
         && (0 < (long)excess)) {
        CVar4 = (**(code **)(k_local[4].writebytecount + 0x68))
                          (conn_local,k_local,&excess,(long)&buf + 7);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        if ((buf._7_1_ & 1) != 0) {
          nread._4_4_ = CURLE_OK;
          goto LAB_00130484;
        }
      }
      nread._4_4_ = CURLE_OK;
      if ((res._3_1_ & 1) != CHUNKE_OK >> 0x18) {
        if (0 < (long)excess) {
          Curl_infof((Curl_easy *)conn_local,
                     "Excess found: excess = %zd url = %s (zero-length body)",excess,
                     conn_local[3].http_proxy.port);
        }
        goto LAB_00130484;
      }
    }
    if (((*(ushort *)((long)didwhat_local + 0xd9) & 1) == 0) &&
       ((0 < (long)excess || ((buffersize._7_1_ & 1) != 0)))) {
      if ((*(ulong *)((long)&conn_local[1].proto.httpc.local_settings_num + 2) >> 0x19 & 1) != 0) {
        Curl_conncontrol((connectdata *)k_local,2);
        *comeback_local = true;
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (((*(long *)(didwhat_local + 0x28) == 0) && ((buffersize._7_1_ & 1) == 0)) &&
         ((*(uint *)(k_local[4].writebytecount + 0x84) & 0x40003) != 0)) {
        CVar4 = Curl_http_firstwrite((Curl_easy *)conn_local,(connectdata *)k_local,comeback_local);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        nread._4_4_ = CURLE_OK;
        if ((*comeback_local & 1U) != 0) {
          return CURLE_OK;
        }
      }
      pcVar3 = conn_local;
      *(long *)(didwhat_local + 0x28) = *(long *)(didwhat_local + 0x28) + 1;
      if ((*(ulong *)((long)&conn_local[1].proto.httpc.local_settings_num + 2) >> 0x1b & 1) != 0) {
        if (didwhat_local[0x16] == 0) {
          Curl_debug((Curl_easy *)conn_local,CURLINFO_DATA_IN,*(char **)(didwhat_local + 0x18),
                     excess);
        }
        else {
          pcVar6 = Curl_dyn_ptr((dynbuf *)&conn_local[2].http_proxy.proxytype);
          sVar7 = Curl_dyn_len((dynbuf *)&conn_local[2].http_proxy.proxytype);
          Curl_debug((Curl_easy *)pcVar3,CURLINFO_DATA_IN,pcVar6,sVar7);
          if (didwhat_local[0x16] == 1) {
            Curl_debug((Curl_easy *)conn_local,CURLINFO_DATA_IN,*(char **)(didwhat_local + 0x18),
                       excess);
          }
        }
      }
      if ((*(ushort *)((long)didwhat_local + 0xd9) >> 5 & 1) != 0) {
        code = Curl_httpchunk_read((Curl_easy *)conn_local,*(char **)(didwhat_local + 0x18),excess,
                                   (ssize_t *)&excess,&local_b8);
        pcVar3 = conn_local;
        if (CHUNKE_OK < code) {
          if (code == CHUNKE_PASSTHRU_ERROR) {
            Curl_failf((Curl_easy *)conn_local,"Failed reading the chunked-encoded stream");
            return local_b8;
          }
          pcVar6 = Curl_chunked_strerror(code);
          Curl_failf((Curl_easy *)pcVar3,"%s in chunked-encoding",pcVar6);
          return CURLE_RECV_ERROR;
        }
        if ((code == CHUNKE_STOP) &&
           (didwhat_local[0x1d] = didwhat_local[0x1d] & 0xfffffffe, k_local->pendingheader != 0)) {
          Curl_infof((Curl_easy *)conn_local,"Leftovers after chunking: % ldu bytes",
                     k_local->pendingheader);
        }
      }
      if ((didwhat_local[0x16] == 1) && ((*(ushort *)((long)didwhat_local + 0xd9) >> 3 & 1) == 0)) {
        sVar7 = Curl_dyn_len((dynbuf *)&conn_local[2].http_proxy.proxytype);
        *(size_t *)(didwhat_local + 4) = sVar7 + *(long *)(didwhat_local + 4);
      }
      if ((*(long *)(didwhat_local + 2) != -1) &&
         (*(long *)(didwhat_local + 2) <= (long)(*(long *)(didwhat_local + 4) + excess))) {
        _maxloops = (char *)((*(long *)(didwhat_local + 4) + excess) - *(long *)(didwhat_local + 2))
        ;
        if ((_maxloops != (char *)0x0) && ((*(ushort *)((long)didwhat_local + 0xd9) >> 3 & 1) == 0))
        {
          Curl_infof((Curl_easy *)conn_local,
                     "Excess found in a read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld"
                     ,_maxloops,*(undefined8 *)didwhat_local,*(undefined8 *)(didwhat_local + 2),
                     *(undefined8 *)(didwhat_local + 4));
          Curl_conncontrol((connectdata *)k_local,1);
        }
        excess = *(long *)(didwhat_local + 2) - *(long *)(didwhat_local + 4);
        if ((long)excess < 0) {
          excess = 0;
        }
        if ((totalleft._6_1_ & 1) == 0) {
          didwhat_local[0x1d] = didwhat_local[0x1d] & 0xfffffffe;
        }
      }
      *(size_t *)(didwhat_local + 4) = excess + *(long *)(didwhat_local + 4);
      Curl_pgrsSetDownloadCounter((Curl_easy *)conn_local,*(curl_off_t *)(didwhat_local + 4));
      if (((*(ushort *)((long)didwhat_local + 0xd9) >> 5 & 1) == 0) &&
         (((excess != 0 || (didwhat_local[0x16] != 0)) || ((buffersize._7_1_ & 1) != 0)))) {
        if ((didwhat_local[0x16] != 0) && ((*(ushort *)((long)didwhat_local + 0xd9) >> 3 & 1) == 0))
        {
          sVar7 = Curl_dyn_len((dynbuf *)&conn_local[2].http_proxy.proxytype);
          pcVar3 = conn_local;
          if ((*(long *)(didwhat_local + 2) == -1) || ((long)sVar7 <= *(long *)(didwhat_local + 2)))
          {
            pcVar6 = Curl_dyn_ptr((dynbuf *)&conn_local[2].http_proxy.proxytype);
            nread._4_4_ = Curl_client_write((Curl_easy *)pcVar3,1,pcVar6,sVar7);
          }
          else {
            pcVar6 = Curl_dyn_ptr((dynbuf *)&conn_local[2].http_proxy.proxytype);
            nread._4_4_ = Curl_client_write((Curl_easy *)pcVar3,1,pcVar6,
                                            *(size_t *)(didwhat_local + 2));
          }
          if (nread._4_4_ != CURLE_OK) {
            return nread._4_4_;
          }
        }
        if ((uint)didwhat_local[0x16] < 2) {
          if (((*(ulong *)((long)&conn_local[1].proto.httpc.local_settings_num + 2) >> 0x23 & 1) ==
               0) && (*(long *)(didwhat_local + 0x24) != 0)) {
            if (((*(ushort *)((long)didwhat_local + 0xd9) >> 3 & 1) == 0) && (excess != 0)) {
              nread._4_4_ = Curl_unencode_write((Curl_easy *)conn_local,
                                                *(contenc_writer **)(didwhat_local + 0x24),
                                                *(char **)(didwhat_local + 0x18),excess);
            }
          }
          else if (((*(ushort *)((long)didwhat_local + 0xd9) >> 3 & 1) == 0) && (excess != 0)) {
            nread._4_4_ = Curl_client_write((Curl_easy *)conn_local,1,
                                            *(char **)(didwhat_local + 0x18),excess);
          }
        }
        didwhat_local[0x16] = 0;
        if (nread._4_4_ != CURLE_OK) {
          return nread._4_4_;
        }
      }
    }
    if ((*(long *)(k_local[4].writebytecount + 0x68) != 0) && (_maxloops != (char *)0x0)) break;
    if ((buffersize._7_1_ & 1) != 0) {
      didwhat_local[0x1d] = didwhat_local[0x1d] & 0xfffffffe;
    }
    if ((didwhat_local[0x1d] & 0x10U) != 0) goto LAB_00130484;
    iVar5 = data_pending((Curl_easy *)conn_local);
    iVar1 = (int)buf;
    if (iVar5 != 0) {
      buf._0_4_ = (int)buf + -1;
    }
    if (iVar5 == 0 || iVar1 == 0) {
LAB_00130484:
      if ((int)buf < 1) {
        *(undefined4 *)((long)&k_local[6].writebytecount + 4) = 1;
        *p_Stack_40 = true;
      }
      if (((didwhat_local[0x1d] & 3U) == 2) &&
         ((*(uint *)((long)&k_local[3].doh + 4) >> 6 & 1) != 0)) {
        Curl_infof((Curl_easy *)conn_local,"we are done reading and this is set to close, stop send"
                  );
        didwhat_local[0x1d] = didwhat_local[0x1d] & 0xfffffffd;
      }
      return CURLE_OK;
    }
  }
  *(size_t *)(didwhat_local + 0x18) = excess + *(long *)(didwhat_local + 0x18);
  if (pcStack_68 + *(uint *)&conn_local[1].http_proxy.field_0x2c <
      _maxloops + *(long *)(didwhat_local + 0x18)) {
    _maxloops = pcStack_68 +
                ((ulong)*(uint *)&conn_local[1].http_proxy.field_0x2c -
                *(long *)(didwhat_local + 0x18));
  }
  excess = (size_t)_maxloops;
  CVar4 = (**(code **)(k_local[4].writebytecount + 0x68))(conn_local,k_local,&excess,(long)&buf + 7)
  ;
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  if ((buf._7_1_ & 1) != 0) {
    didwhat_local[0x1d] = didwhat_local[0x1d] | 1;
  }
  nread._4_4_ = CURLE_OK;
  goto LAB_00130484;
}

Assistant:

static CURLcode readwrite_data(struct Curl_easy *data,
                               struct connectdata *conn,
                               struct SingleRequest *k,
                               int *didwhat, bool *done,
                               bool *comeback)
{
  CURLcode result = CURLE_OK;
  ssize_t nread; /* number of bytes read */
  size_t excess = 0; /* excess bytes read */
  bool readmore = FALSE; /* used by RTP to signal for more data */
  int maxloops = 100;
  char *buf = data->state.buffer;
  DEBUGASSERT(buf);

  *done = FALSE;
  *comeback = FALSE;

  /* This is where we loop until we have read everything there is to
     read or we get a CURLE_AGAIN */
  do {
    bool is_empty_data = FALSE;
    size_t buffersize = data->set.buffer_size;
    size_t bytestoread = buffersize;
#ifdef USE_NGHTTP2
    bool is_http2 = ((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
                     (conn->httpversion == 20));
#endif
    bool is_http3 =
#ifdef ENABLE_QUIC
      ((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
       (conn->httpversion == 30));
#else
      FALSE;
#endif

    if(
#ifdef USE_NGHTTP2
      /* For HTTP/2, read data without caring about the content length. This
         is safe because body in HTTP/2 is always segmented thanks to its
         framing layer. Meanwhile, we have to call Curl_read to ensure that
         http2_handle_stream_close is called when we read all incoming bytes
         for a particular stream. */
      !is_http2 &&
#endif
      !is_http3 && /* Same reason mentioned above. */
      k->size != -1 && !k->header) {
      /* make sure we don't read too much */
      curl_off_t totalleft = k->size - k->bytecount;
      if(totalleft < (curl_off_t)bytestoread)
        bytestoread = (size_t)totalleft;
    }

    if(bytestoread) {
      /* receive data from the network! */
      result = Curl_read(data, conn->sockfd, buf, bytestoread, &nread);

      /* read would've blocked */
      if(CURLE_AGAIN == result)
        break; /* get out of loop */

      if(result>0)
        return result;
    }
    else {
      /* read nothing but since we wanted nothing we consider this an OK
         situation to proceed from */
      DEBUGF(infof(data, "readwrite_data: we're done"));
      nread = 0;
    }

    if(!k->bytecount) {
      Curl_pgrsTime(data, TIMER_STARTTRANSFER);
      if(k->exp100 > EXP100_SEND_DATA)
        /* set time stamp to compare with when waiting for the 100 */
        k->start100 = Curl_now();
    }

    *didwhat |= KEEP_RECV;
    /* indicates data of zero size, i.e. empty file */
    is_empty_data = ((nread == 0) && (k->bodywrites == 0)) ? TRUE : FALSE;

    if(0 < nread || is_empty_data) {
      buf[nread] = 0;
    }
    else {
      /* if we receive 0 or less here, either the http2 stream is closed or the
         server closed the connection and we bail out from this! */
#ifdef USE_NGHTTP2
      if(is_http2 && !nread)
        DEBUGF(infof(data, "nread == 0, stream closed, bailing"));
      else
#endif
      if(is_http3 && !nread)
        DEBUGF(infof(data, "nread == 0, stream closed, bailing"));
      else
        DEBUGF(infof(data, "nread <= 0, server closed connection, bailing"));
      k->keepon &= ~KEEP_RECV;
      break;
    }

    /* Default buffer to use when we write the buffer, it may be changed
       in the flow below before the actual storing is done. */
    k->str = buf;

    if(conn->handler->readwrite) {
      result = conn->handler->readwrite(data, conn, &nread, &readmore);
      if(result)
        return result;
      if(readmore)
        break;
    }

#ifndef CURL_DISABLE_HTTP
    /* Since this is a two-state thing, we check if we are parsing
       headers at the moment or not. */
    if(k->header) {
      /* we are in parse-the-header-mode */
      bool stop_reading = FALSE;
      result = Curl_http_readwrite_headers(data, conn, &nread, &stop_reading);
      if(result)
        return result;

      if(conn->handler->readwrite &&
         (k->maxdownload <= 0 && nread > 0)) {
        result = conn->handler->readwrite(data, conn, &nread, &readmore);
        if(result)
          return result;
        if(readmore)
          break;
      }

      if(stop_reading) {
        /* We've stopped dealing with input, get out of the do-while loop */

        if(nread > 0) {
          infof(data,
                "Excess found:"
                " excess = %zd"
                " url = %s (zero-length body)",
                nread, data->state.up.path);
        }

        break;
      }
    }
#endif /* CURL_DISABLE_HTTP */


    /* This is not an 'else if' since it may be a rest from the header
       parsing, where the beginning of the buffer is headers and the end
       is non-headers. */
    if(!k->header && (nread > 0 || is_empty_data)) {

      if(data->set.opt_no_body) {
        /* data arrives although we want none, bail out */
        streamclose(conn, "ignoring body");
        *done = TRUE;
        return CURLE_WEIRD_SERVER_REPLY;
      }

#ifndef CURL_DISABLE_HTTP
      if(0 == k->bodywrites && !is_empty_data) {
        /* These checks are only made the first time we are about to
           write a piece of the body */
        if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
          /* HTTP-only checks */
          result = Curl_http_firstwrite(data, conn, done);
          if(result || *done)
            return result;
        }
      } /* this is the first time we write a body part */
#endif /* CURL_DISABLE_HTTP */

      k->bodywrites++;

      /* pass data to the debug function before it gets "dechunked" */
      if(data->set.verbose) {
        if(k->badheader) {
          Curl_debug(data, CURLINFO_DATA_IN,
                     Curl_dyn_ptr(&data->state.headerb),
                     Curl_dyn_len(&data->state.headerb));
          if(k->badheader == HEADER_PARTHEADER)
            Curl_debug(data, CURLINFO_DATA_IN,
                       k->str, (size_t)nread);
        }
        else
          Curl_debug(data, CURLINFO_DATA_IN,
                     k->str, (size_t)nread);
      }

#ifndef CURL_DISABLE_HTTP
      if(k->chunk) {
        /*
         * Here comes a chunked transfer flying and we need to decode this
         * properly.  While the name says read, this function both reads
         * and writes away the data. The returned 'nread' holds the number
         * of actual data it wrote to the client.
         */
        CURLcode extra;
        CHUNKcode res =
          Curl_httpchunk_read(data, k->str, nread, &nread, &extra);

        if(CHUNKE_OK < res) {
          if(CHUNKE_PASSTHRU_ERROR == res) {
            failf(data, "Failed reading the chunked-encoded stream");
            return extra;
          }
          failf(data, "%s in chunked-encoding", Curl_chunked_strerror(res));
          return CURLE_RECV_ERROR;
        }
        if(CHUNKE_STOP == res) {
          /* we're done reading chunks! */
          k->keepon &= ~KEEP_RECV; /* read no more */

          /* N number of bytes at the end of the str buffer that weren't
             written to the client. */
          if(conn->chunk.datasize) {
            infof(data, "Leftovers after chunking: % "
                  CURL_FORMAT_CURL_OFF_T "u bytes",
                  conn->chunk.datasize);
          }
        }
        /* If it returned OK, we just keep going */
      }
#endif   /* CURL_DISABLE_HTTP */

      /* Account for body content stored in the header buffer */
      if((k->badheader == HEADER_PARTHEADER) && !k->ignorebody) {
        size_t headlen = Curl_dyn_len(&data->state.headerb);
        DEBUGF(infof(data, "Increasing bytecount by %zu", headlen));
        k->bytecount += headlen;
      }

      if((-1 != k->maxdownload) &&
         (k->bytecount + nread >= k->maxdownload)) {

        excess = (size_t)(k->bytecount + nread - k->maxdownload);
        if(excess > 0 && !k->ignorebody) {
          infof(data,
                "Excess found in a read:"
                " excess = %zu"
                ", size = %" CURL_FORMAT_CURL_OFF_T
                ", maxdownload = %" CURL_FORMAT_CURL_OFF_T
                ", bytecount = %" CURL_FORMAT_CURL_OFF_T,
                excess, k->size, k->maxdownload, k->bytecount);
          connclose(conn, "excess found in a read");
        }

        nread = (ssize_t) (k->maxdownload - k->bytecount);
        if(nread < 0) /* this should be unusual */
          nread = 0;

        /* HTTP/3 over QUIC should keep reading until QUIC connection
           is closed.  In contrast to HTTP/2 which can stop reading
           from TCP connection, HTTP/3 over QUIC needs ACK from server
           to ensure stream closure.  It should keep reading. */
        if(!is_http3) {
          k->keepon &= ~KEEP_RECV; /* we're done reading */
        }
      }

      k->bytecount += nread;

      Curl_pgrsSetDownloadCounter(data, k->bytecount);

      if(!k->chunk && (nread || k->badheader || is_empty_data)) {
        /* If this is chunky transfer, it was already written */

        if(k->badheader && !k->ignorebody) {
          /* we parsed a piece of data wrongly assuming it was a header
             and now we output it as body instead */
          size_t headlen = Curl_dyn_len(&data->state.headerb);

          /* Don't let excess data pollute body writes */
          if(k->maxdownload == -1 || (curl_off_t)headlen <= k->maxdownload)
            result = Curl_client_write(data, CLIENTWRITE_BODY,
                                       Curl_dyn_ptr(&data->state.headerb),
                                       headlen);
          else
            result = Curl_client_write(data, CLIENTWRITE_BODY,
                                       Curl_dyn_ptr(&data->state.headerb),
                                       (size_t)k->maxdownload);

          if(result)
            return result;
        }
        if(k->badheader < HEADER_ALLBAD) {
          /* This switch handles various content encodings. If there's an
             error here, be sure to check over the almost identical code
             in http_chunks.c.
             Make sure that ALL_CONTENT_ENCODINGS contains all the
             encodings handled here. */
          if(data->set.http_ce_skip || !k->writer_stack) {
            if(!k->ignorebody && nread) {
#ifndef CURL_DISABLE_POP3
              if(conn->handler->protocol & PROTO_FAMILY_POP3)
                result = Curl_pop3_write(data, k->str, nread);
              else
#endif /* CURL_DISABLE_POP3 */
                result = Curl_client_write(data, CLIENTWRITE_BODY, k->str,
                                           nread);
            }
          }
          else if(!k->ignorebody && nread)
            result = Curl_unencode_write(data, k->writer_stack, k->str, nread);
        }
        k->badheader = HEADER_NORMAL; /* taken care of now */

        if(result)
          return result;
      }

    } /* if(!header and data to read) */

    if(conn->handler->readwrite && excess) {
      /* Parse the excess data */
      k->str += nread;

      if(&k->str[excess] > &buf[data->set.buffer_size]) {
        /* the excess amount was too excessive(!), make sure
           it doesn't read out of buffer */
        excess = &buf[data->set.buffer_size] - k->str;
      }
      nread = (ssize_t)excess;

      result = conn->handler->readwrite(data, conn, &nread, &readmore);
      if(result)
        return result;

      if(readmore)
        k->keepon |= KEEP_RECV; /* we're not done reading */
      break;
    }

    if(is_empty_data) {
      /* if we received nothing, the server closed the connection and we
         are done */
      k->keepon &= ~KEEP_RECV;
    }

    if(k->keepon & KEEP_RECV_PAUSE) {
      /* this is a paused transfer */
      break;
    }

  } while(data_pending(data) && maxloops--);

  if(maxloops <= 0) {
    /* we mark it as read-again-please */
    conn->cselect_bits = CURL_CSELECT_IN;
    *comeback = TRUE;
  }

  if(((k->keepon & (KEEP_RECV|KEEP_SEND)) == KEEP_SEND) &&
     conn->bits.close) {
    /* When we've read the entire thing and the close bit is set, the server
       may now close the connection. If there's now any kind of sending going
       on from our side, we need to stop that immediately. */
    infof(data, "we are done reading and this is set to close, stop send");
    k->keepon &= ~KEEP_SEND; /* no writing anymore either */
  }

  return CURLE_OK;
}